

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *outpubkey,
                      ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  size_t __size;
  ptls_key_exchange_context_t *ppVar1;
  size_t sVar2;
  int iVar3;
  uint8_t *__dest;
  ptls_iovec_t peerkey_00;
  ptls_key_exchange_context_t *ctx;
  ptls_key_exchange_context_t *local_40;
  size_t local_38;
  
  local_38 = peerkey.len;
  peerkey_00.base = peerkey.base;
  local_40 = (ptls_key_exchange_context_t *)0x0;
  outpubkey->base = (uint8_t *)0x0;
  iVar3 = evp_keyex_create(algo,&local_40);
  sVar2 = local_38;
  ppVar1 = local_40;
  if (iVar3 == 0) {
    __size = (local_40->pubkey).len;
    __dest = (uint8_t *)malloc(__size);
    outpubkey->base = __dest;
    if (__dest != (uint8_t *)0x0) {
      memcpy(__dest,(ppVar1->pubkey).base,__size);
      outpubkey->len = __size;
      peerkey_00.len = sVar2;
      iVar3 = evp_keyex_on_exchange(&local_40,1,secret,peerkey_00);
      if (local_40 != (ptls_key_exchange_context_t *)0x0) {
        __assert_fail("ctx == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/openssl.c"
                      ,0x295,
                      "int evp_keyex_exchange(ptls_key_exchange_algorithm_t *, ptls_iovec_t *, ptls_iovec_t *, ptls_iovec_t)"
                     );
      }
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_001263ab;
    }
    iVar3 = 0x201;
  }
  else if (local_40 == (ptls_key_exchange_context_t *)0x0) goto LAB_001263ab;
  evp_keyex_on_exchange(&local_40,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
LAB_001263ab:
  free(outpubkey->base);
  return iVar3;
}

Assistant:

static int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *outpubkey, ptls_iovec_t *secret,
                              ptls_iovec_t peerkey)
{
    ptls_key_exchange_context_t *ctx = NULL;
    int ret;

    outpubkey->base = NULL;

    if ((ret = evp_keyex_create(algo, &ctx)) != 0)
        goto Exit;
    if ((outpubkey->base = malloc(ctx->pubkey.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(outpubkey->base, ctx->pubkey.base, ctx->pubkey.len);
    outpubkey->len = ctx->pubkey.len;
    ret = evp_keyex_on_exchange(&ctx, 1, secret, peerkey);
    assert(ctx == NULL);

Exit:
    if (ctx != NULL)
        evp_keyex_on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    if (ret != 0)
        free(outpubkey->base);
    return ret;
}